

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

bool __thiscall ON_UuidList::Read(ON_UuidList *this,ON_BinaryArchive *archive,bool bSortAferRead)

{
  bool bVar1;
  bool local_25;
  int local_24;
  int iStack_20;
  bool rc;
  int minor_version;
  int major_version;
  bool bSortAferRead_local;
  ON_BinaryArchive *archive_local;
  ON_UuidList *this_local;
  
  (this->super_ON_SimpleArray<ON_UUID_struct>).m_count = 0;
  this->m_removed_count = 0;
  this->m_sorted_count = 0;
  iStack_20 = 0;
  local_24 = 0;
  minor_version._3_1_ = bSortAferRead;
  _major_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  local_25 = ON_BinaryArchive::BeginRead3dmChunk
                       (archive,0x40008000,&stack0xffffffffffffffe0,&local_24);
  if (local_25) {
    if (iStack_20 != 1) {
      local_25 = false;
    }
    if (local_25 != false) {
      local_25 = ON_BinaryArchive::ReadArray
                           (_major_version,&this->super_ON_SimpleArray<ON_UUID_struct>);
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_major_version);
    if (!bVar1) {
      local_25 = false;
    }
  }
  if ((minor_version._3_1_ & 1) == 0) {
    PurgeHelper(this);
  }
  else {
    SortHelper(this);
  }
  return local_25;
}

Assistant:

bool ON_UuidList::Read( 
    class ON_BinaryArchive& archive,
    bool bSortAferRead
    )
{
  // NOTE:
  // Per bug 101403, this function is called with
  // bSortAferRead = false when reading ON_HistoryRecord::m_descendants[].
  // All other used call this function with bSortAferRead = true.
  m_count = 0;
  m_removed_count = 0;
  m_sorted_count = 0;
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, 
                                       &major_version, 
                                       &minor_version );
  if (rc)
  {
    if ( 1 != major_version )
      rc = false;

    if (rc)
      rc = archive.ReadArray( *this );

    if ( !archive.EndRead3dmChunk() )
      rc = false;
  }

  if ( bSortAferRead )
  {
    // clean and sort
    SortHelper();
  }
  else
  {
    // clean
    PurgeHelper();
  }

  return rc;
}